

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

error_code __thiscall
llvm::sys::fs::createTemporaryFile
          (fs *this,Twine *Prefix,StringRef Suffix,SmallVectorImpl<char> *ResultPath)

{
  undefined8 uVar1;
  undefined8 in_RAX;
  error_code eVar2;
  StringRef Suffix_00;
  int FD;
  undefined8 uStack_18;
  int iStack_14;
  
  Suffix_00.Data = Suffix.Data;
  Suffix_00.Length = (size_t)&iStack_14;
  uVar1 = in_RAX;
  eVar2 = createTemporaryFile(this,Prefix,Suffix_00,(int *)Suffix.Length,
                              (SmallVectorImpl<char> *)0x1,(FSEntity)in_RAX);
  uStack_18 = uVar1;
  if (eVar2._M_value == 0) {
    close(iStack_14);
  }
  eVar2._4_4_ = 0;
  return eVar2;
}

Assistant:

std::error_code createTemporaryFile(const Twine &Prefix, StringRef Suffix,
                                    SmallVectorImpl<char> &ResultPath) {
  int FD;
  auto EC = createTemporaryFile(Prefix, Suffix, FD, ResultPath);
  if (EC)
    return EC;
  // FD is only needed to avoid race conditions. Close it right away.
  close(FD);
  return EC;
}